

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_64_8_e166d2b6 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.applicationNode = 0;
  gcFrame.result = 0;
  gcFrame.analysisFunction = 0;
  gcFrame.expansionResult = 0;
  gcFrame.functionOrMacroExpression = 0;
  gcFrame.functionOrMacroExpressionType = 0;
  gcFrame.macro = 0;
  gcFrame.unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t *)0x0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 8;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.functionOrMacroExpression =
       sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  if ((gcFrame.functionOrMacroExpression & 0xf) == 0 && gcFrame.functionOrMacroExpression != 0) {
    gcFrame.functionOrMacroExpressionType =
         *(sysbvm_tuple_t *)(gcFrame.functionOrMacroExpression + 0x20);
  }
  else {
    gcFrame.functionOrMacroExpressionType = 0;
  }
  sVar2 = sysbvm_tuple_getType(context,gcFrame.functionOrMacroExpressionType);
  gcFrame.analysisFunction =
       sysbvm_type_getAnalyzeUnexpandedApplicationNodeWithEnvironmentFunction(context,sVar2);
  if (gcFrame.analysisFunction == 0) {
    _Var1 = sysbvm_astNode_isMacroExpression(context,gcFrame.functionOrMacroExpression);
    if (_Var1) {
      _Var1 = sysbvm_astNode_isLiteralNode(context,gcFrame.functionOrMacroExpression);
      if (!_Var1) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:2177: assertion failure: sysbvm_astNode_isLiteralNode(context, gcFrame.functionOrMacroExpression)"
                  );
      }
      gcFrame.macro = sysbvm_astLiteralNode_getValue(gcFrame.functionOrMacroExpression);
      gcFrame.expansionResult =
           sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                     (context,arguments,&gcFrame.macro,arguments + 1);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_48);
      sVar2 = gcFrame.expansionResult;
    }
    else {
      gcFrame.applicationNode =
           sysbvm_astFunctionApplicationNode_create
                     (context,*(sysbvm_tuple_t *)(*arguments + 0x10),
                      gcFrame.functionOrMacroExpression,*(sysbvm_tuple_t *)(*arguments + 0x30));
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_48);
      sVar2 = gcFrame.applicationNode;
    }
    gcFrame.result =
         sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                   (context,sVar2,arguments[1]);
  }
  else {
    gcFrame.unexpandedNode =
         (sysbvm_astUnexpandedApplicationNode_t *)sysbvm_context_shallowCopy(context,*arguments);
    (gcFrame.unexpandedNode)->functionOrMacroExpression = gcFrame.functionOrMacroExpression;
    gcFrame.result =
         sysbvm_function_apply3
                   (context,gcFrame.analysisFunction,gcFrame.functionOrMacroExpressionType,
                    (sysbvm_tuple_t)gcFrame.unexpandedNode,arguments[1]);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_48);
  }
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t macro;
        sysbvm_astUnexpandedApplicationNode_t *unexpandedNode;
        sysbvm_tuple_t functionOrMacroExpression;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t applicationNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacroExpression = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.functionOrMacroExpression);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeUnexpandedApplicationNodeWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*unexpandedNode);
        gcFrame.unexpandedNode->functionOrMacroExpression = gcFrame.functionOrMacroExpression;

        gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)gcFrame.unexpandedNode, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    // Is this a macro?
    bool isMacro = sysbvm_astNode_isMacroExpression(context, gcFrame.functionOrMacroExpression);
    if(isMacro)
    {
        SYSBVM_ASSERT(sysbvm_astNode_isLiteralNode(context, gcFrame.functionOrMacroExpression));
        gcFrame.macro = sysbvm_astLiteralNode_getValue(gcFrame.functionOrMacroExpression);
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.macro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Convert into application node and then analyze it.
    gcFrame.applicationNode = sysbvm_astFunctionApplicationNode_create(context, (*unexpandedNode)->super.sourcePosition, gcFrame.functionOrMacroExpression, (*unexpandedNode)->arguments);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.applicationNode, *environment);
}